

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O0

int vfio_epoll_ctl(int event_fd)

{
  int iVar1;
  int *piVar2;
  int in_EDI;
  char buf_1 [512];
  int err_1;
  int64_t result_1;
  char buf [512];
  int err;
  int64_t result;
  int epoll_fd;
  epoll_event event;
  undefined1 local_448 [524];
  int local_23c;
  long local_238;
  long local_230;
  undefined1 local_228 [516];
  int local_24;
  long local_20;
  int local_14;
  epoll_event local_10;
  
  local_10.events = 1;
  local_10.data.u64._4_4_ = in_EDI;
  local_14 = epoll_create1(0);
  local_230 = (long)local_14;
  local_20 = local_230;
  if (local_230 == -1) {
    piVar2 = __errno_location();
    local_24 = *piVar2;
    __xpg_strerror_r(local_24,local_228,0x200);
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
            0xd7,"vfio_epoll_ctl","to created epoll",local_228);
    exit(local_24);
  }
  iVar1 = epoll_ctl(local_14,1,local_10.data.u64._4_4_,&local_10);
  local_238 = (long)iVar1;
  if (local_238 == -1) {
    piVar2 = __errno_location();
    local_23c = *piVar2;
    __xpg_strerror_r(local_23c,local_448,0x200);
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
            0xd9,"vfio_epoll_ctl","to initialize epoll",local_448);
    exit(local_23c);
  }
  return local_14;
}

Assistant:

int vfio_epoll_ctl(int event_fd) {
	struct epoll_event event;
	event.events = EPOLLIN;
	event.data.fd = event_fd;

	int epoll_fd = (int) check_err(epoll_create1(0), "to created epoll");

	check_err(epoll_ctl(epoll_fd, EPOLL_CTL_ADD, event_fd, &event), "to initialize epoll");

	return epoll_fd;
}